

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifvin(bifcxdef *ctx,int argc)

{
  long lVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  int in_ESI;
  runsdef *in_RDI;
  runsdef *unaff_retaddr;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  runsdef val;
  uchar *p;
  ushort siz;
  int flg_dis_do;
  prpnum prp_verio;
  prpnum prp_io;
  prpnum prp_verdo;
  prpnum prp_do;
  int newstyle;
  uchar tplbuf [16];
  objnum prep;
  objnum verb;
  int in_stack_ffffffffffffff9c;
  prpnum prpn;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  runsdef local_58;
  uchar *local_48;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  ushort uVar7;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  undefined2 in_stack_ffffffffffffffce;
  objnum in_stack_ffffffffffffffd4;
  objnum in_stack_ffffffffffffffd6;
  voccxdef *in_stack_ffffffffffffffd8;
  undefined1 auStack_20 [2];
  byte local_1e;
  ushort uVar8;
  ushort uVar9;
  
  lVar1 = *(long *)((in_RDI->runsv).runsvnum + 0x20);
  *(long *)((in_RDI->runsv).runsvnum + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x02') {
    *(undefined4 *)(**(long **)(in_RDI->runsv).runsvstr + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
            in_stack_ffffffffffffff9c);
  }
  uVar9 = *(ushort *)(*(long *)((in_RDI->runsv).runsvnum + 0x20) + 8);
  uVar3 = (uint)uVar9;
  if (in_ESI == 1) {
    uVar8 = 0xffff;
  }
  else {
    lVar1 = *(long *)((in_RDI->runsv).runsvnum + 0x20);
    *(long *)((in_RDI->runsv).runsvnum + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x02') {
      *(undefined4 *)(**(long **)(in_RDI->runsv).runsvstr + 0x68) = 0;
      runsign((runcxdef *)(ulong)CONCAT24(uVar9,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
             );
    }
    uVar8 = *(ushort *)(*(long *)((in_RDI->runsv).runsvnum + 0x20) + 8);
    in_stack_ffffffffffffffa0 = (uint)uVar8;
  }
  iVar4 = voctplfnd(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd4,
                    (uchar *)CONCAT26(in_stack_ffffffffffffffce,
                                      CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
                    ,(int *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0));
  prpn = (prpnum)((uint)in_stack_ffffffffffffff9c >> 0x10);
  if (iVar4 == 0) {
    runpnil((runcxdef *)CONCAT44(uVar3,in_stack_ffffffffffffffa0));
  }
  else {
    osrp2(auStack_20);
    osrp2(&stack0xffffffffffffffde);
    osrp2(&stack0xffffffffffffffdc);
    osrp2(&stack0xffffffffffffffda);
    uVar5 = (uint)((local_1e & 1) != 0);
    uVar7 = 8;
    if (uVar8 != 0xffff) {
      uVar7 = 0xc;
    }
    if ((uint)((int)*(undefined8 *)((in_RDI->runsv).runsvnum + 0x40) -
              (int)*(undefined8 *)((in_RDI->runsv).runsvnum + 0x38)) <= (uint)uVar7) {
      runhcmp((runcxdef *)val._0_8_,in_stack_0000000c,in_stack_00000008,unaff_retaddr,in_RDI,
              (runsdef *)CONCAT44(in_ESI,CONCAT22(uVar9,uVar8)));
    }
    local_48 = *(uchar **)((in_RDI->runsv).runsvnum + 0x38);
    oswp2(local_48,(uint)uVar7);
    local_48 = (uchar *)((long)local_48 + 2);
    local_48 = bifvin_putprpn((uchar *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),prpn);
    if (uVar8 == 0xffff) {
      local_48 = bifvin_putprpn((uchar *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),prpn);
    }
    else {
      local_48 = bifvin_putprpn((uchar *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),prpn);
      puVar6 = bifvin_putprpn((uchar *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),prpn);
      uVar2 = '\x05';
      if (uVar5 != 0) {
        uVar2 = '\b';
      }
      local_48 = puVar6 + 1;
      *puVar6 = uVar2;
    }
    local_58.runstyp = '\a';
    local_58.runsv = *(anon_union_8_4_1dda36f5_for_runsv *)((in_RDI->runsv).runsvnum + 0x38);
    *(long *)((in_RDI->runsv).runsvnum + 0x38) =
         *(long *)((in_RDI->runsv).runsvnum + 0x38) + (long)(int)(uint)uVar7;
    runrepush((runcxdef *)(in_RDI->runsv).runsvstr,&local_58);
  }
  return;
}

Assistant:

void bifvin(bifcxdef *ctx, int argc)
{
    objnum  verb;
    objnum  prep;
    uchar   tplbuf[VOCTPL2SIZ];
    int     newstyle;

    /* get the verb */
    verb = runpopobj(ctx->bifcxrun);
    
    /* check for the presence of a preposition */
    if (argc == 1)
    {
        /* no preposition */
        prep = MCMONINV;
    }
    else
    {
        /* the second argument is the preposition */
        bifcntargs(ctx, 2, argc);
        prep = runpopobj(ctx->bifcxrun);
    }

    /* look up the template */
    if (voctplfnd(ctx->bifcxrun->runcxvoc, verb, prep, tplbuf, &newstyle))
    {
        prpnum   prp_do, prp_verdo, prp_io, prp_verio;
        int      flg_dis_do;
        ushort   siz;
        uchar   *p;
        runsdef  val;

        /* get the information from the template */
        prp_do     = voctpldo(tplbuf);
        prp_verdo  = voctplvd(tplbuf);
        prp_io     = voctplio(tplbuf);
        prp_verio  = voctplvi(tplbuf);
        flg_dis_do = (voctplflg(tplbuf) & VOCTPLFLG_DOBJ_FIRST) != 0;

        /*
         *   figure space for the return value: if there's a prep, three
         *   property pointers plus a boolean, otherwise just two property
         *   pointers 
         */
        siz = 2 + 2*(2+1);
        if (prep != MCMONINV)
            siz += (2+1) + 1;

        /* reserve the space */
        runhres(ctx->bifcxrun, siz, 0);

        /* build the output list */
        p = ctx->bifcxrun->runcxhp;
        oswp2(p, siz);
        p += 2;

        p = bifvin_putprpn(p, prp_verdo);
        if (prep == MCMONINV)
        {
            p = bifvin_putprpn(p, prp_do);
        }
        else
        {
            p = bifvin_putprpn(p, prp_verio);
            p = bifvin_putprpn(p, prp_io);
            *p++ = runclog(flg_dis_do);
        }

        /* build the return value */
        val.runstyp = DAT_LIST;
        val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

        /* consume the space */
        ctx->bifcxrun->runcxhp += siz;

        /* return the list */
        runrepush(ctx->bifcxrun, &val);
    }
    else
    {
        /* no template for this verb - return nil */
        runpnil(ctx->bifcxrun);
    }
}